

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

void remove_set(artifact_set *set)

{
  object *obj;
  artifact *paVar1;
  player *ppVar2;
  long lVar3;
  set_item *psVar4;
  ulong uVar5;
  _Bool *p_Var6;
  _Bool *p_Var7;
  
  psVar4 = (set_item *)&set->set_item;
  while (psVar4 = psVar4->next, psVar4 != (set_item *)0x0) {
    ppVar2 = player;
    for (uVar5 = 0; uVar5 < (ppVar2->body).count; uVar5 = uVar5 + 1) {
      obj = (ppVar2->body).slots[uVar5].obj;
      if (((obj != (object *)0x0) && (obj->artifact != (artifact *)0x0)) &&
         (obj->artifact->aidx == psVar4->aidx)) {
        flag_wipe(obj->flags,6);
        flag_union(obj->flags,obj->artifact->flags,6);
        paVar1 = obj->artifact;
        for (lVar3 = 0x29; lVar3 != 0x3a; lVar3 = lVar3 + 1) {
          *(undefined2 *)(obj->flags + lVar3 * 2 + -0x4c) =
               *(undefined2 *)(paVar1->flags + lVar3 * 2 + -0x4c);
        }
        for (lVar3 = 0x1d; lVar3 != 0x39; lVar3 = lVar3 + 1) {
          *(undefined2 *)(obj->flags + lVar3 * 4 + -0x4c) =
               *(undefined2 *)(paVar1->flags + lVar3 * 4 + -0x4c);
        }
        p_Var6 = paVar1->brands;
        p_Var7 = obj->brands;
        if (p_Var6 == (_Bool *)0x0) {
          mem_free(p_Var7);
          obj->brands = (_Bool *)0x0;
        }
        else {
          if (p_Var7 != (_Bool *)0x0) {
            memset(p_Var7,0,(ulong)z_info->brand_max);
            p_Var6 = obj->artifact->brands;
          }
          copy_brands(&obj->brands,p_Var6);
        }
        p_Var6 = obj->slays;
        p_Var7 = obj->artifact->slays;
        if (p_Var7 == (_Bool *)0x0) {
          mem_free(p_Var6);
          obj->slays = (_Bool *)0x0;
        }
        else {
          if (p_Var6 != (_Bool *)0x0) {
            memset(p_Var6,0,(ulong)z_info->slay_max);
            p_Var7 = obj->artifact->slays;
          }
          copy_slays(&obj->slays,p_Var7);
        }
        player_know_object(player,obj);
        ppVar2 = player;
      }
    }
  }
  msg("Item set no longer completed.");
  return;
}

Assistant:

void remove_set(struct artifact_set *set)
{
	struct set_item *item = set->set_item;
	while (item) {
		int i, j;
		/* Find the item worn by the player */
		for (i = 0; i < player->body.count; i++) {
			struct object *obj = player->body.slots[i].obj;
			if (obj && obj->artifact && (obj->artifact->aidx == item->aidx)) {
				/* Remove flags */
				of_wipe(obj->flags);
				of_union(obj->flags, obj->artifact->flags);

				/* Remove modifiers */
				for (j = 0; j < OBJ_MOD_MAX; j++) {
					obj->modifiers[j] = obj->artifact->modifiers[j];
				}

				/* Remove extra resists */
				for (j = 0; j < ELEM_MAX; j++) {
					obj->el_info[j].res_level =
						obj->artifact->el_info[j].res_level;
				}

				/* Brands */
				if (obj->artifact->brands) {
					if (obj->brands) {
						memset(obj->brands, 0,
							z_info->brand_max
							* sizeof(*obj->brands));
					}
					copy_brands(&obj->brands,
						obj->artifact->brands);
				} else {
					mem_free(obj->brands);
					obj->brands = NULL;
				}

				/* Slays */
				if (obj->artifact->slays) {
					if (obj->slays) {
						memset(obj->slays, 0,
							z_info->slay_max
							* sizeof(*obj->slays));
					}
					copy_slays(&obj->slays,
						obj->artifact->slays);
				} else {
					mem_free(obj->slays);
					obj->slays = NULL;
				}

				player_know_object(player, obj);
			}
		}
		item = item->next;
	}

	/* Notify */
	msg("Item set no longer completed.");
}